

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * newkey(lua_State *L,Table *t,TValue *key)

{
  Node *__src;
  TValue *pTVar1;
  Node *n;
  Node *othern;
  Node *mp;
  TValue *key_local;
  Table *t_local;
  lua_State *L_local;
  
  __src = mainposition(t,key);
  if (((__src->i_val).tt != 0) || (othern = __src, __src == &dummynode_)) {
    othern = getfreepos(t);
    if (othern == (Node *)0x0) {
      rehash(L,t,key);
      pTVar1 = luaH_set(L,t,key);
      return pTVar1;
    }
    n = mainposition(t,&(__src->i_key).tvk);
    if (n == __src) {
      (othern->i_key).nk.next = (__src->i_key).nk.next;
      (__src->i_key).nk.next = othern;
    }
    else {
      for (; (n->i_key).nk.next != __src; n = (n->i_key).nk.next) {
      }
      (n->i_key).nk.next = othern;
      memcpy(othern,__src,0x28);
      (__src->i_key).nk.next = (Node *)0x0;
      (__src->i_val).tt = 0;
      othern = __src;
    }
  }
  (othern->i_key).nk.value = key->value;
  (othern->i_key).nk.tt = key->tt;
  if (((3 < key->tt) && (((((key->value).gc)->gch).marked & 3) != 0)) && ((t->marked & 4) != 0)) {
    luaC_barrierback(L,t);
  }
  return &othern->i_val;
}

Assistant:

static TValue*newkey(lua_State*L,Table*t,const TValue*key){
Node*mp=mainposition(t,key);
if(!ttisnil(gval(mp))||mp==(&dummynode_)){
Node*othern;
Node*n=getfreepos(t);
if(n==NULL){
rehash(L,t,key);
return luaH_set(L,t,key);
}
othern=mainposition(t,key2tval(mp));
if(othern!=mp){
while(gnext(othern)!=mp)othern=gnext(othern);
gnext(othern)=n;
*n=*mp;
gnext(mp)=NULL;
setnilvalue(gval(mp));
}
else{
gnext(n)=gnext(mp);
gnext(mp)=n;
mp=n;
}
}
gkey(mp)->value=key->value;gkey(mp)->tt=key->tt;
luaC_barriert(L,t,key);
return gval(mp);
}